

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctpl.h
# Opt level: O0

void __thiscall ctpl::thread_pool::set_thread(thread_pool *this,int i)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  reference pvVar1;
  reference this_01;
  thread *this_02;
  undefined1 local_48 [8];
  type f;
  shared_ptr<std::atomic<bool>_> flag;
  int i_local;
  thread_pool *this_local;
  
  pvVar1 = std::
           vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
           ::operator[](&this->flags,(long)i);
  this_00 = &f.flag.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<std::atomic<bool>_>::shared_ptr((shared_ptr<std::atomic<bool>_> *)this_00,pvVar1);
  local_48 = (undefined1  [8])this;
  f.this._0_4_ = i;
  std::shared_ptr<std::atomic<bool>_>::shared_ptr
            ((shared_ptr<std::atomic<bool>_> *)&f.i,(shared_ptr<std::atomic<bool>_> *)this_00);
  this_01 = std::
            vector<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
            ::operator[](&this->threads,(long)i);
  this_02 = (thread *)operator_new(8);
  std::thread::thread<ctpl::thread_pool::set_thread(int)::_lambda()_1_&,,void>
            (this_02,(type *)local_48);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::reset(this_01,this_02);
  set_thread(int)::{lambda()#1}::~set_thread((_lambda___1_ *)local_48);
  std::shared_ptr<std::atomic<bool>_>::~shared_ptr
            ((shared_ptr<std::atomic<bool>_> *)
             &f.flag.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void set_thread(int i) {
            std::shared_ptr<std::atomic<bool>> flag(this->flags[i]);  // a copy of the shared ptr to the flag
            auto f = [this, i, flag/* a copy of the shared ptr to the flag */]() {
                std::atomic<bool>& _flag = *flag;
                std::function<void(int id)>* _f;
                bool isPop = this->q.pop(_f);
                while (true) {
                    while (isPop) {  // if there is anything in the queue
                        std::unique_ptr<std::function<void(int id)>> func(_f);  // at return, delete the function even if an exception occurred
                        (*_f)(i);

                        if (_flag)
                            return;  // the thread is wanted to stop, return even if the queue is not empty yet
                        else
                            isPop = this->q.pop(_f);
                    }

                    // the queue is empty here, wait for the next command
                    std::unique_lock<std::mutex> lock(this->mutex);
                    ++this->nWaiting;
                    this->cv.wait(lock, [this, &_f, &isPop, &_flag]() { isPop = this->q.pop(_f); return isPop || this->isDone || _flag; });
                    --this->nWaiting;

                    if (!isPop)
                        return;  // if the queue is empty and this->isDone == true or *flag then return
                }
            };
            this->threads[i].reset(new std::thread(f));  // compiler may not support std::make_unique()
        }